

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end_bzip2(archive *a,la_zstream *lastrm)

{
  bz_stream *strm_00;
  int iVar1;
  int r;
  bz_stream *strm;
  la_zstream *lastrm_local;
  archive *a_local;
  
  strm_00 = (bz_stream *)lastrm->real_stream;
  iVar1 = BZ2_bzCompressEnd(strm_00);
  free(strm_00);
  lastrm->real_stream = (void *)0x0;
  lastrm->valid = 0;
  if (iVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    archive_set_error(a,-1,"Failed to clean up compressor");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_end_bzip2(struct archive *a, struct la_zstream *lastrm)
{
	bz_stream *strm;
	int r;

	strm = (bz_stream *)lastrm->real_stream;
	r = BZ2_bzCompressEnd(strm);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	if (r != BZ_OK) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}